

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psVar1;
  undefined8 uVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  nonempty_iterator ppcVar8;
  undefined8 uVar9;
  pointer psVar10;
  pointer psVar11;
  pointer psVar12;
  undefined8 uVar13;
  char *pcVar14;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int i;
  int iVar19;
  pointer ppcVar20;
  float fVar21;
  pair<unsigned_long,_unsigned_long> pVar22;
  Settings __tmp;
  pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r_2;
  pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  size_type expected_buckets;
  TypeParam other_ht;
  hasher hasher;
  KeyInfo __tmp_1;
  SetKey<const_char_*,_Identity> local_2d9;
  Hasher local_2d8;
  pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_2c8;
  undefined1 local_270 [16];
  iterator iStack_260;
  iterator local_258;
  sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psStack_250;
  undefined8 local_248;
  iterator iStack_240;
  iterator local_238;
  nonempty_iterator ppcStack_230;
  char *local_228;
  undefined8 local_220;
  vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_218;
  ulong local_1e0;
  undefined8 uStack_1d8;
  SetKey<const_char_*,_Identity> local_1c1;
  undefined1 local_1c0 [16];
  iterator iStack_1b0;
  iterator local_1a8;
  nonempty_iterator ppcStack_1a0;
  undefined8 local_198;
  iterator iStack_190;
  iterator local_188;
  nonempty_iterator ppcStack_180;
  char *local_178;
  undefined8 local_170;
  vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_168;
  ulong local_130;
  undefined8 uStack_128;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  Hasher local_10c;
  undefined **local_100;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_f8;
  Hasher local_54 [3];
  
  local_54[0].id_ = 1;
  local_54[0].num_hashes_ = 0;
  local_54[0].num_compares_ = 0;
  local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffff00000000;
  local_1c0._8_8_ =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_100 = &PTR__BaseHashtableInterface_00c26158;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&local_f8,200,local_54,local_54,(Identity *)local_270,
                     (SetKey<const_char_*,_Identity> *)&local_2c8,
                     (Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *)local_1c0);
  local_100 = &PTR__BaseHashtableInterface_00c260d8;
  pcVar14 = UniqueObjectHelper<char_const*>(1);
  psVar1 = &(this->
            super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ).
            super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_.
            super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(psVar1);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>
           + 0x2a) = true;
  (this->
  super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = pcVar14;
  psVar15 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             *)UniqueObjectHelper<char_const*>(2);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&local_f8);
  local_f8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_deleted_
       = true;
  iVar19 = 3;
  local_f8.key_info.delkey = (type)psVar15;
  do {
    local_270._0_8_ = UniqueObjectHelper<char_const*>(iVar19);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(psVar1,1);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                       *)local_1c0,psVar1,(const_reference)local_270);
    iVar19 = iVar19 + 1;
  } while (iVar19 != 2000);
  local_1c0._0_8_ = UniqueObjectHelper<char_const*>(1000);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::erase(psVar1,(key_type *)local_1c0);
  local_270._0_8_ = UniqueObjectHelper<char_const*>(0x7d1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_f8,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_1c0,&local_f8,(const_reference)local_270);
  local_118 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_f8.table.settings.table_size;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::swap(psVar1,&local_f8);
  local_270._0_8_ = UniqueObjectHelper<char_const*>(2);
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)(this->
          super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.key_info.delkey;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_1c0,"this->UniqueKey(2)","this->ht_.deleted_key()",(char **)local_270
             ,(char **)&local_2c8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1db,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_270._0_8_ = UniqueObjectHelper<char_const*>(1);
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_f8.key_info.delkey;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_1c0,"this->UniqueKey(1)","other_ht.deleted_key()",(char **)local_270,
             (char **)&local_2c8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1dc,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_270._0_4_ = 1;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_2c8.first.ht._4_4_,
                   (psVar1->settings).
                   super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
                   id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c0,"1","this->ht_.hash_funct().id()",(int *)local_270,
             (int *)&local_2c8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1de,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_270._0_8_ = local_270._0_8_ & 0xffffffff00000000;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_2c8.first.ht._4_4_,
                   local_f8.settings.
                   super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
                   id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c0,"0","other_ht.hash_funct().id()",(int *)local_270,
             (int *)&local_2c8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1df,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_270._0_4_ = 1;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_2c8.first.ht._4_4_,
                   (this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.key_info.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c0,"1","this->ht_.key_eq().id()",(int *)local_270,(int *)&local_2c8)
  ;
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e1,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_270._0_8_ = local_270._0_8_ & 0xffffffff00000000;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_2c8.first.ht._4_4_,local_f8.key_info.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c0,"0","other_ht.key_eq().id()",(int *)local_270,(int *)&local_2c8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e2,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_270._0_8_ =
       *(size_type *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.table.settings + 0x10);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1c0,"expected_buckets","this->ht_.bucket_count()",
             (unsigned_long *)&local_118,(unsigned_long *)local_270);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e4,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_270._0_8_ = local_f8.table.settings.table_size;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_2c8.first.ht._4_4_,200);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((internal *)local_1c0,"other_ht.bucket_count()","200u",(unsigned_long *)local_270,
             (uint *)&local_2c8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e5,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_2c8.first.ht._4_4_,1);
  local_270._0_8_ =
       *(size_type *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.table.settings + 0x18) -
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.num_deleted;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"1u","this->ht_.size()",(uint *)&local_2c8,
             (unsigned_long *)local_270);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e7,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_2c8.first.ht._4_4_,0x7cc);
  local_270._0_8_ = local_f8.table.settings.num_buckets - local_f8.num_deleted;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"1996u","other_ht.size()",(uint *)&local_2c8,
             (unsigned_long *)local_270);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e8,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_2d8._0_8_ = (ulong)(uint)local_2d8.num_hashes_ << 0x20;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(0x6f);
  pVar22 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)psVar1,(char **)&local_2c8);
  local_270._1_7_ = 0;
  local_270[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"0u","this->ht_.count(this->UniqueKey(111))",(uint *)&local_2d8,
             (unsigned_long *)local_270);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ea,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_2d8.id_ = 1;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(0x6f);
  pVar22 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)&local_f8,(char **)&local_2c8);
  local_270._1_7_ = 0;
  local_270[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"1u","other_ht.count(this->UniqueKey(111))",(uint *)&local_2d8,
             (unsigned_long *)local_270);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1eb,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_2d8.id_ = 1;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(0x7d1);
  pVar22 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)psVar1,(char **)&local_2c8);
  local_270._1_7_ = 0;
  local_270[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"1u","this->ht_.count(this->UniqueKey(2001))",(uint *)&local_2d8,
             (unsigned_long *)local_270);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ec,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_2d8._0_8_ = local_2d8._0_8_ & 0xffffffff00000000;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(0x7d1);
  pVar22 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)&local_f8,(char **)&local_2c8);
  local_270._1_7_ = 0;
  local_270[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"0u","other_ht.count(this->UniqueKey(2001))",(uint *)&local_2d8,
             (unsigned_long *)local_270);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ed,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_2d8._0_8_ = local_2d8._0_8_ & 0xffffffff00000000;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(1000);
  pVar22 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)psVar1,(char **)&local_2c8);
  local_270._1_7_ = 0;
  local_270[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"0u","this->ht_.count(this->UniqueKey(1000))",(uint *)&local_2d8,
             (unsigned_long *)local_270);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ee,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_2d8._0_8_ = local_2d8._0_8_ & 0xffffffff00000000;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(1000);
  pVar22 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)&local_f8,(char **)&local_2c8);
  local_270._1_7_ = 0;
  local_270[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"0u","other_ht.count(this->UniqueKey(1000))",(uint *)&local_2d8,
             (unsigned_long *)local_270);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ef,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::swap(psVar1,&local_f8);
  local_270._0_8_ = UniqueObjectHelper<char_const*>(1);
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)(this->
          super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.key_info.delkey;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_1c0,"this->UniqueKey(1)","this->ht_.deleted_key()",(char **)local_270
             ,(char **)&local_2c8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fc,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_270._0_8_ = UniqueObjectHelper<char_const*>(2);
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_f8.key_info.delkey;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_1c0,"this->UniqueKey(2)","other_ht.deleted_key()",(char **)local_270,
             (char **)&local_2c8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fd,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_270._0_8_ = local_270._0_8_ & 0xffffffff00000000;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_2c8.first.ht._4_4_,
                   (psVar1->settings).
                   super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
                   id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c0,"0","this->ht_.hash_funct().id()",(int *)local_270,
             (int *)&local_2c8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fe,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_270._0_4_ = 1;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_2c8.first.ht._4_4_,
                   local_f8.settings.
                   super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher.
                   id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c0,"1","other_ht.hash_funct().id()",(int *)local_270,
             (int *)&local_2c8);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ff,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_2c8.first.ht._4_4_,0x7cc);
  local_270._0_8_ =
       *(size_type *)
        ((long)&(this->
                super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.table.settings + 0x18) -
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.num_deleted;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"1996u","this->ht_.size()",(uint *)&local_2c8,
             (unsigned_long *)local_270);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x200,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_2c8.first.ht._4_4_,1);
  local_270._0_8_ = local_f8.table.settings.num_buckets - local_f8.num_deleted;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"1u","other_ht.size()",(uint *)&local_2c8,
             (unsigned_long *)local_270);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x201,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_2d8.id_ = 1;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(0x6f);
  pVar22 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)psVar1,(char **)&local_2c8);
  local_270._1_7_ = 0;
  local_270[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"1u","this->ht_.count(this->UniqueKey(111))",(uint *)&local_2d8,
             (unsigned_long *)local_270);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x202,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_2d8._0_8_ = local_2d8._0_8_ & 0xffffffff00000000;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<char_const*>(0x6f);
  pVar22 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)&local_f8,(char **)&local_2c8);
  local_270._1_7_ = 0;
  local_270[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c0,"0u","other_ht.count(this->UniqueKey(111))",(uint *)&local_2d8,
             (unsigned_long *)local_270);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_1c0._8_8_ ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar20 = (pointer)0xafc493;
    }
    else {
      ppcVar20 = *(pointer *)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x203,(char *)ppcVar20);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._0_8_ + 8))();
    }
  }
  uVar2 = local_1c0._8_8_;
  if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_1c0._8_8_ !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)*(pointer *)local_1c0._8_8_ !=
        &(((Settings *)(local_1c0._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_1c0._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_2c8.first.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_2c8.first.pos.row_begin._M_current._4_4_ << 0x20);
  local_2d8._0_8_ = (char *)0x0;
  local_2d8.num_compares_ = 0;
  local_270._0_8_ = local_270._0_8_ & 0xffffffff00000000;
  local_270._8_8_ =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  psVar1 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            *)(local_1c0 + 8);
  local_1c0._0_8_ = &PTR__BaseHashtableInterface_00c26158;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(psVar1,0,(Hasher *)&local_2c8,&local_2d8,(Identity *)&local_10c,&local_2d9,
                     (Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *)local_270);
  local_1c0._0_8_ = &PTR__BaseHashtableInterface_00c260d8;
  pcVar14 = UniqueObjectHelper<char_const*>(1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(psVar1);
  iStack_190._M_current._2_1_ = 1;
  iVar19 = 2;
  local_178 = pcVar14;
  do {
    local_2c8.first.ht =
         (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)UniqueObjectHelper<char_const*>(iVar19);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(psVar1,1);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                       *)local_270,psVar1,(const_reference)&local_2c8);
    iVar19 = iVar19 + 1;
  } while (iVar19 != 10000);
  local_2d8._0_8_ = (char *)0x0;
  local_2d8.num_compares_ = 0;
  local_10c.id_ = 0;
  local_10c.num_hashes_ = 0;
  local_10c.num_compares_ = 0;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_2c8.first.ht & 0xffffffff00000000);
  local_2c8.first.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_270._0_8_ = &PTR__BaseHashtableInterface_00c26158;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)(local_270 + 8),0,&local_2d8,&local_10c,(Identity *)&local_2d9,&local_1c1,
                     (Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *)&local_2c8);
  uVar18 = local_130;
  iVar5._M_current = local_198;
  uVar13 = uStack_1d8;
  uVar16 = local_1e0;
  psVar12 = local_218.
            super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar11 = local_218.
            super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  psVar10 = local_218.
            super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = local_220;
  pcVar14 = local_228;
  ppcVar8 = ppcStack_230;
  iVar7._M_current = local_238._M_current;
  iVar6._M_current = iStack_240._M_current;
  iVar4._M_current = local_248;
  iVar3._M_current = iStack_260._M_current;
  uVar2 = local_270._8_8_;
  local_270._0_8_ = &PTR__BaseHashtableInterface_00c260d8;
  local_2c8.first.pos.col_current = (nonempty_iterator)local_248;
  local_2c8.first.end.row_begin._M_current = iStack_240._M_current;
  local_2c8.first.pos.row_end._M_current = local_258._M_current;
  local_2c8.first.pos.row_current._M_current = psStack_250;
  local_2c8.first.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_270._8_8_;
  local_2c8.first.pos.row_begin._M_current = iStack_260._M_current;
  local_248 = local_198;
  local_270._8_8_ = local_1c0._8_8_;
  iStack_260._M_current = iStack_1b0._M_current;
  local_198 = iVar4._M_current;
  local_1c0._8_8_ = uVar2;
  iStack_1b0._M_current = iVar3._M_current;
  local_228 = local_178;
  local_238._M_current = local_188._M_current;
  ppcStack_230 = ppcStack_180;
  local_178 = pcVar14;
  local_188._M_current = iVar7._M_current;
  ppcStack_180 = ppcVar8;
  local_220 = local_170;
  local_170 = uVar9;
  local_218.
  super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_168.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_218.
  super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_168.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_218.
  super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_168.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_168.
  super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ._M_impl.super__Vector_impl_data._M_start = psVar10;
  local_168.
  super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar11;
  local_168.
  super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar12;
  local_1e0 = local_130;
  uStack_1d8 = uStack_128;
  local_130 = uVar16;
  uStack_128 = uVar13;
  local_248._0_4_ = SUB84(iVar5._M_current,0);
  local_248._0_4_ = (float)local_248 * (float)uVar18;
  uVar17 = (ulong)(float)local_248;
  local_258._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)((long)((float)local_248 - 9.223372e+18) & (long)uVar17 >> 0x3f | uVar17);
  local_248._4_4_ = (float)((ulong)iVar5._M_current >> 0x20);
  local_248._4_4_ = (float)uVar18 * local_248._4_4_;
  uVar18 = (ulong)local_248._4_4_;
  psStack_250 = (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)((long)(local_248._4_4_ - 9.223372e+18) & (long)uVar18 >> 0x3f | uVar18);
  iStack_240._M_current = iStack_190._M_current & 0xffffffffffffff00;
  fVar21 = (float)uVar16;
  local_198._0_4_ = SUB84(iVar4._M_current,0);
  local_198._0_4_ = (float)local_198 * fVar21;
  uVar16 = (ulong)(float)local_198;
  local_1a8._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)((long)((float)local_198 - 9.223372e+18) & (long)uVar16 >> 0x3f | uVar16);
  local_198._4_4_ = (float)((ulong)iVar4._M_current >> 0x20);
  fVar21 = fVar21 * local_198._4_4_;
  uVar16 = (ulong)fVar21;
  ppcStack_1a0 = (nonempty_iterator)((long)(fVar21 - 9.223372e+18) & (long)uVar16 >> 0x3f | uVar16);
  iStack_190._M_current = iVar6._M_current & 0xffffffffffffff00;
  local_248 = iVar5._M_current;
  local_198 = iVar4._M_current;
  pcVar14 = UniqueObjectHelper<char_const*>(1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(psVar1);
  iStack_190._M_current._2_1_ = 1;
  iVar19 = 2;
  local_178 = pcVar14;
  do {
    local_2d8._0_8_ = UniqueObjectHelper<char_const*>(iVar19);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(psVar1,1);
    google::
    sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize(&local_2c8,psVar1,(const_reference)&local_2d8);
    iVar19 = iVar19 + 1;
  } while (iVar19 != 10000);
  local_270._0_8_ = &PTR__BaseHashtableInterface_00c26158;
  std::
  vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_218);
  local_1c0._0_8_ = &PTR__BaseHashtableInterface_00c26158;
  std::
  vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_168);
  local_100 = &PTR__BaseHashtableInterface_00c26158;
  std::
  vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_f8.table.groups);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}